

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O0

Fl_Double_Window * make_comment_panel(void)

{
  Fl_Window *this;
  Fl_Widget *pFVar1;
  Fl_Group *pFVar2;
  Fl_Window *this_00;
  Fl_Button *pFVar3;
  Fl_Group *pFVar4;
  Fl_Box *o_5;
  Fl_Group *o_4;
  Fl_Box *o_3;
  Fl_Group *o_2;
  CodeEditor *o_1;
  Fl_Double_Window *o;
  
  this = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this,0x226,0x118,"Comment Properties");
  comment_panel = (Fl_Double_Window *)this;
  Fl_Widget::labelsize((Fl_Widget *)this,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x1c0);
  CodeEditor::CodeEditor((CodeEditor *)pFVar1,0x6e,10,0x1ae,0xe6,(char *)0x0);
  comment_input = (CodeEditor *)pFVar1;
  Fl_Widget::box(pFVar1,FL_DOWN_BOX);
  Fl_Widget::color((Fl_Widget *)comment_input,7);
  Fl_Widget::selection_color((Fl_Widget *)comment_input,0xf);
  Fl_Widget::labeltype((Fl_Widget *)comment_input,FL_NORMAL_LABEL);
  Fl_Widget::labelfont((Fl_Widget *)comment_input,0);
  Fl_Widget::labelsize((Fl_Widget *)comment_input,0xb);
  Fl_Widget::labelcolor((Fl_Widget *)comment_input,0);
  Fl_Text_Display::textfont((Fl_Text_Display *)comment_input,4);
  CodeEditor::textsize(comment_input,0xb);
  Fl_Widget::align((Fl_Widget *)comment_input,1);
  Fl_Widget::when((Fl_Widget *)comment_input,'\x04');
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,(Fl_Widget *)comment_input);
  Fl_Widget::when(pFVar1,'\x0f');
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,0x6e,0xfa,0x1ae,0x14,(char *)0x0);
  Fl_Widget::labelsize((Fl_Widget *)pFVar2,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar1,0x172,0xfa,0x50,0x14,"OK");
  comment_panel_ok = (Fl_Return_Button *)pFVar1;
  Fl_Widget::labelsize(pFVar1,0xb);
  this_00 = Fl_Widget::window((Fl_Widget *)comment_panel_ok);
  Fl_Window::hotspot(this_00,(Fl_Widget *)comment_panel_ok,0);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,0x1cc,0xfa,0x50,0x14,"Cancel");
  comment_panel_cancel = pFVar3;
  Fl_Button::shortcut(pFVar3,0xff1b);
  Fl_Widget::labelsize(&comment_panel_cancel->super_Fl_Widget,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,0x6e,0xfa,0xfa,0x14,(char *)0x0);
  Fl_Widget::labelsize(pFVar1,0xb);
  pFVar4 = Fl_Group::current();
  Fl_Group::resizable(pFVar4,pFVar1);
  Fl_Group::end(pFVar2);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,10,0x5a,0xf3,(char *)0x0);
  Fl_Widget::labelsize((Fl_Widget *)pFVar2,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar1,10,10,0x5a,0x14,"In Source");
  comment_in_source = (Fl_Light_Button *)pFVar1;
  Fl_Widget::tooltip(pFVar1,"Put the comment into the source (.cxx) file.");
  Fl_Widget::labelsize((Fl_Widget *)comment_in_source,0xb);
  Fl_Widget::when((Fl_Widget *)comment_in_source,'\0');
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar1,10,0x28,0x5a,0x14,"In Header");
  comment_in_header = (Fl_Light_Button *)pFVar1;
  Fl_Widget::tooltip(pFVar1,"Put the comment into the header (.h) file.");
  Fl_Widget::labelsize((Fl_Widget *)comment_in_header,0xb);
  Fl_Widget::when((Fl_Widget *)comment_in_header,'\0');
  pFVar1 = (Fl_Widget *)operator_new(0x98);
  Fl_Menu_Button::Fl_Menu_Button((Fl_Menu_Button *)pFVar1,10,0x46,0x5a,0x14,"Predefined");
  comment_predefined = (Fl_Menu_Button *)pFVar1;
  Fl_Widget::labelsize(pFVar1,0xb);
  Fl_Menu_::textsize(&comment_predefined->super_Fl_Menu_,0xb);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,10,100,0x5a,0x14,"Import...");
  comment_load = pFVar3;
  Fl_Widget::labelsize((Fl_Widget *)pFVar3,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,10,0x84,0x5a,0x79,(char *)0x0);
  Fl_Widget::labelsize(pFVar1,0xb);
  pFVar4 = Fl_Group::current();
  Fl_Group::resizable(pFVar4,pFVar1);
  Fl_Group::end(pFVar2);
  Fl_Window::size_range(this,0x140,0xb4,0,0,0,0,0);
  Fl_Window::set_modal(&comment_panel->super_Fl_Window);
  Fl_Group::end((Fl_Group *)comment_panel);
  return comment_panel;
}

Assistant:

Fl_Double_Window* make_comment_panel() {
  { Fl_Double_Window* o = comment_panel = new Fl_Double_Window(550, 280, "Comment Properties");
    comment_panel->labelsize(11);
    { CodeEditor* o = comment_input = new CodeEditor(110, 10, 430, 230);
      comment_input->box(FL_DOWN_BOX);
      comment_input->color(FL_BACKGROUND2_COLOR);
      comment_input->selection_color(FL_SELECTION_COLOR);
      comment_input->labeltype(FL_NORMAL_LABEL);
      comment_input->labelfont(0);
      comment_input->labelsize(11);
      comment_input->labelcolor(FL_FOREGROUND_COLOR);
      comment_input->textfont(4);
      comment_input->textsize(11);
      comment_input->align(Fl_Align(FL_ALIGN_TOP));
      comment_input->when(FL_WHEN_RELEASE);
      Fl_Group::current()->resizable(comment_input);
      o->when(FL_WHEN_ENTER_KEY_CHANGED|FL_WHEN_RELEASE);
    } // CodeEditor* comment_input
    { Fl_Group* o = new Fl_Group(110, 250, 430, 20);
      o->labelsize(11);
      { comment_panel_ok = new Fl_Return_Button(370, 250, 80, 20, "OK");
        comment_panel_ok->labelsize(11);
        comment_panel_ok->window()->hotspot(comment_panel_ok);
      } // Fl_Return_Button* comment_panel_ok
      { comment_panel_cancel = new Fl_Button(460, 250, 80, 20, "Cancel");
        comment_panel_cancel->shortcut(0xff1b);
        comment_panel_cancel->labelsize(11);
      } // Fl_Button* comment_panel_cancel
      { Fl_Box* o = new Fl_Box(110, 250, 250, 20);
        o->labelsize(11);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 10, 90, 243);
      o->labelsize(11);
      { comment_in_source = new Fl_Light_Button(10, 10, 90, 20, "In Source");
        comment_in_source->tooltip("Put the comment into the source (.cxx) file.");
        comment_in_source->labelsize(11);
        comment_in_source->when(FL_WHEN_NEVER);
      } // Fl_Light_Button* comment_in_source
      { comment_in_header = new Fl_Light_Button(10, 40, 90, 20, "In Header");
        comment_in_header->tooltip("Put the comment into the header (.h) file.");
        comment_in_header->labelsize(11);
        comment_in_header->when(FL_WHEN_NEVER);
      } // Fl_Light_Button* comment_in_header
      { comment_predefined = new Fl_Menu_Button(10, 70, 90, 20, "Predefined");
        comment_predefined->labelsize(11);
        comment_predefined->textsize(11);
      } // Fl_Menu_Button* comment_predefined
      { comment_load = new Fl_Button(10, 100, 90, 20, "Import...");
        comment_load->labelsize(11);
      } // Fl_Button* comment_load
      { Fl_Box* o = new Fl_Box(10, 132, 90, 121);
        o->labelsize(11);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    o->size_range(320, 180);
    comment_panel->set_modal();
    comment_panel->end();
  } // Fl_Double_Window* comment_panel
  return comment_panel;
}